

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_layer_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Layer *layer,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  LayerMetas *pLVar3;
  long lVar4;
  size_type sVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *puVar6;
  size_type sVar7;
  const_reference pvVar8;
  string *__x;
  pointer ppVar9;
  uint32_t uVar10;
  uint32_t n;
  string local_4b8;
  reference local_498;
  value_type *item_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *__range2_1;
  size_t i_1;
  _Self local_450;
  _Self local_448;
  iterator it;
  token nameTok;
  size_t i;
  PrimSpec *local_408;
  reference local_400;
  value_type *item;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  primNameTable;
  string local_390 [32];
  string local_370;
  stringstream local_350 [8];
  stringstream meta_ss;
  ostream aoStack_340 [376];
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  Layer *pLStack_18;
  uint32_t indent_local;
  Layer *layer_local;
  
  local_1c = (uint)layer;
  pLStack_18 = (Layer *)this;
  layer_local = (Layer *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::operator<<(poVar2,"#usda 1.0\n");
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::stringstream::stringstream(local_350);
  pLVar3 = Layer::metas(pLStack_18);
  print_layer_metas_abi_cxx11_
            (&local_370,(tinyusdz *)pLVar3,(LayerMetas *)(ulong)(local_1c + 1),indent);
  ::std::operator<<(aoStack_340,(string *)&local_370);
  ::std::__cxx11::string::~string((string *)&local_370);
  ::std::__cxx11::stringstream::str();
  lVar4 = ::std::__cxx11::string::size();
  ::std::__cxx11::string::~string(local_390);
  if (lVar4 != 0) {
    ::std::operator<<(aoStack_198,"(\n");
    ::std::__cxx11::stringstream::str();
    ::std::operator<<(aoStack_198,
                      (string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::__cxx11::string::~string
              ((string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::operator<<(aoStack_198,")\n");
  }
  ::std::operator<<(aoStack_198,"\n");
  pLVar3 = Layer::metas(pLStack_18);
  sVar5 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                    (&pLVar3->primChildren);
  puVar6 = Layer::primspecs_abi_cxx11_(pLStack_18);
  sVar7 = ::std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
          ::size(puVar6);
  if (sVar5 == sVar7) {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
           *)&__range2);
    puVar6 = Layer::primspecs_abi_cxx11_(pLStack_18);
    __end2 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
             ::begin(puVar6);
    item = (value_type *)
           ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
           ::end(puVar6);
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                               *)&__end2,
                              (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                               *)&item), bVar1) {
      local_400 = ::std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
                  ::operator*(&__end2);
      local_408 = &local_400->second;
      ::std::
      map<std::__cxx11::string,tinyusdz::PrimSpec_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
      ::emplace<std::__cxx11::string_const&,tinyusdz::PrimSpec_const*>
                ((map<std::__cxx11::string,tinyusdz::PrimSpec_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                  *)&__range2,&local_400->first,&local_408);
      ::std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
      ::operator++(&__end2);
    }
    nameTok.str_.field_2._8_8_ = 0;
    while( true ) {
      pLVar3 = Layer::metas(pLStack_18);
      sVar5 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        (&pLVar3->primChildren);
      if (sVar5 <= (ulong)nameTok.str_.field_2._8_8_) break;
      pLVar3 = Layer::metas(pLStack_18);
      uVar10 = (uint32_t)sVar5;
      pvVar8 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                         (&pLVar3->primChildren,nameTok.str_.field_2._8_8_);
      Token::Token((Token *)&it,pvVar8);
      __x = Token::str_abi_cxx11_((Token *)&it);
      local_448._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                   *)&__range2,__x);
      local_450._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                  *)&__range2);
      bVar1 = ::std::operator!=(&local_448,&local_450);
      if (bVar1) {
        ppVar9 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>
                 ::operator->(&local_448);
        prim::print_primspec_abi_cxx11_
                  ((string *)&i_1,(prim *)ppVar9->second,(PrimSpec *)(ulong)local_1c,uVar10);
        ::std::operator<<(aoStack_198,(string *)&i_1);
        ::std::__cxx11::string::~string((string *)&i_1);
        pLVar3 = Layer::metas(pLStack_18);
        sVar5 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          (&pLVar3->primChildren);
        if (nameTok.str_.field_2._8_8_ != sVar5 - 1) {
          ::std::operator<<(aoStack_198,"\n");
        }
      }
      Token::~Token((Token *)&it);
      nameTok.str_.field_2._8_8_ = nameTok.str_.field_2._8_8_ + 1;
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
            *)&__range2);
  }
  else {
    puVar6 = Layer::primspecs_abi_cxx11_(pLStack_18);
    __end2_1 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
               ::begin(puVar6);
    item_1 = (value_type *)
             ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
             ::end(puVar6);
    while( true ) {
      uVar10 = (uint32_t)sVar7;
      bVar1 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                          *)&__end2_1,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                          *)&item_1);
      if (!bVar1) break;
      local_498 = ::std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
                  ::operator*(&__end2_1);
      prim::print_primspec_abi_cxx11_
                (&local_4b8,(prim *)&local_498->second,(PrimSpec *)(ulong)local_1c,uVar10);
      ::std::operator<<(aoStack_198,(string *)&local_4b8);
      ::std::__cxx11::string::~string((string *)&local_4b8);
      puVar6 = Layer::primspecs_abi_cxx11_(pLStack_18);
      sVar7 = ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
              ::size(puVar6);
      sVar7 = sVar7 - 1;
      if (sVar7 != 0) {
        ::std::operator<<(aoStack_198,"\n");
      }
      ::std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
      ::operator++(&__end2_1);
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_350);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_layer(const Layer &layer, const uint32_t indent) {
  std::stringstream ss;

  // FIXME: print magic-header outside of this function?
  ss << pprint::Indent(indent) << "#usda 1.0\n";

  std::stringstream meta_ss;
  meta_ss << print_layer_metas(layer.metas(), indent + 1);

  if (meta_ss.str().size()) {
    ss << "(\n";
    ss << meta_ss.str();
    ss << ")\n";
  }

  ss << "\n";

  if (layer.metas().primChildren.size() == layer.primspecs().size()) {
    std::map<std::string, const PrimSpec *> primNameTable;
    for (const auto &item : layer.primspecs()) {
      primNameTable.emplace(item.first, &item.second);
    }

    for (size_t i = 0; i < layer.metas().primChildren.size(); i++) {
      value::token nameTok = layer.metas().primChildren[i];
      // DCOUT(fmt::format("primChildren  {}/{} = {}", i,
      //                   layer.metas().primChildren.size(), nameTok.str()));
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        ss << prim::print_primspec((*it->second), indent);
        if (i != (layer.metas().primChildren.size() - 1)) {
          ss << "\n";
        }
      } else {
        // TODO: Report warning?
      }
    }
  } else {
    size_t i = 0;
    for (const auto &item : layer.primspecs()) {
      ss << prim::print_primspec(item.second, indent);
      if (i != (layer.primspecs().size() - 1)) {
        ss << "\n";
      }
    }
  }

  return ss.str();
}